

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O1

void log_reconfig(LogContext *ctx,Conf *conf)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  Filename *f1;
  Filename *f2;
  Conf *pCVar4;
  
  f1 = conf_get_filename(ctx->conf,0x81);
  f2 = conf_get_filename(conf,0x81);
  _Var1 = filename_equal(f1,f2);
  if (_Var1) {
    iVar2 = conf_get_int(ctx->conf,0x82);
    iVar3 = conf_get_int(conf,0x82);
    if (iVar2 == iVar3) {
      conf_free(ctx->conf);
      pCVar4 = conf_copy(conf);
      ctx->conf = pCVar4;
      iVar2 = conf_get_int(pCVar4,0x82);
      ctx->logtype = iVar2;
      return;
    }
  }
  if ((FILE *)ctx->lgfp != (FILE *)0x0) {
    fclose((FILE *)ctx->lgfp);
    ctx->lgfp = (FILE *)0x0;
  }
  ctx->state = L_CLOSED;
  conf_free(ctx->conf);
  pCVar4 = conf_copy(conf);
  ctx->conf = pCVar4;
  iVar2 = conf_get_int(pCVar4,0x82);
  ctx->logtype = iVar2;
  logfopen(ctx);
  return;
}

Assistant:

void log_reconfig(LogContext *ctx, Conf *conf)
{
    bool reset_logging;

    if (!filename_equal(conf_get_filename(ctx->conf, CONF_logfilename),
                        conf_get_filename(conf, CONF_logfilename)) ||
        conf_get_int(ctx->conf, CONF_logtype) !=
        conf_get_int(conf, CONF_logtype))
        reset_logging = true;
    else
        reset_logging = false;

    if (reset_logging)
        logfclose(ctx);

    conf_free(ctx->conf);
    ctx->conf = conf_copy(conf);

    ctx->logtype = conf_get_int(ctx->conf, CONF_logtype);

    if (reset_logging)
        logfopen(ctx);
}